

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

void __thiscall mat<3UL,_3UL>::set_col(mat<3UL,_3UL> *this,size_t idx,vec<3UL,_double> *v)

{
  double *pdVar1;
  size_t i;
  vec<3UL,_double> *this_00;
  double dVar2;
  
  if (idx < 3) {
    this_00 = this->rows + 2;
    for (i = 2; i != 0xffffffffffffffff; i = i - 1) {
      dVar2 = vec<3UL,_double>::operator[](v,i);
      pdVar1 = vec<3UL,_double>::operator[](this_00,idx);
      *pdVar1 = dVar2;
      this_00 = this_00 + -1;
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xbe,
                "void mat<3, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 3, ncols = 3]"
               );
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }